

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linalg.cc
# Opt level: O1

void gmath::svd(Matrixd *a,Matrixd *U,Vectord *W,Matrixd *V,bool thin)

{
  double dVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  int iVar4;
  EVP_PKEY_CTX *pEVar5;
  double *pdVar6;
  int iVar7;
  double *pdVar8;
  undefined8 *puVar9;
  uint uVar10;
  EVP_PKEY_CTX *ctx;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  double dVar15;
  uint uVar16;
  double *pdVar17;
  ulong uVar18;
  int iVar19;
  int iVar20;
  double *pdVar21;
  int iVar22;
  undefined7 in_register_00000081;
  double *pdVar23;
  long lVar24;
  int iVar25;
  EVP_PKEY_CTX *pEVar26;
  int iVar27;
  double *pdVar28;
  uint uVar29;
  EVP_PKEY_CTX *pEVar30;
  double dVar31;
  double dVar32;
  undefined1 auVar33 [16];
  int iVar35;
  undefined1 auVar34 [16];
  ulong uVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  double dVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  int iVar45;
  Vectord e;
  Matrixd A;
  Vectord work;
  EVP_PKEY_CTX *local_148;
  long local_138;
  double *local_128;
  DVector<double> local_118;
  double local_108;
  undefined8 uStack_100;
  Matrixd *local_f0;
  EVP_PKEY_CTX *local_e8;
  double *local_e0;
  ulong local_d8;
  DMatrix<double> local_c8;
  EVP_PKEY_CTX *local_b0;
  double *local_a8;
  double *local_98;
  double *local_80;
  ulong local_78;
  double *local_70;
  long local_68;
  DVector<double> local_50;
  ulong local_40;
  long local_38;
  
  DMatrix<double>::DMatrix(&local_c8,a);
  iVar20 = local_c8.ncols;
  local_e0 = (double *)(ulong)(uint)local_c8.nrows;
  pEVar5 = (EVP_PKEY_CTX *)(ulong)(uint)local_c8.ncols;
  uVar16 = local_c8.nrows;
  if (local_c8.ncols < local_c8.nrows) {
    uVar16 = local_c8.ncols;
  }
  if ((int)CONCAT71(in_register_00000081,thin) == 0) {
    uVar16 = local_c8.nrows;
  }
  DMatrix<double>::init(U,(EVP_PKEY_CTX *)(ulong)(uint)local_c8.nrows);
  lVar14 = (long)local_c8.nrows;
  if (0 < (long)U->n) {
    memset(U->v,0,(long)U->n << 3);
  }
  pEVar30 = (EVP_PKEY_CTX *)(ulong)(local_c8.nrows + 1U);
  if (iVar20 < (int)(local_c8.nrows + 1U)) {
    pEVar30 = pEVar5;
  }
  DVector<double>::init(W,pEVar30);
  ctx = (EVP_PKEY_CTX *)(long)iVar20;
  DMatrix<double>::init(V,pEVar5);
  if (0 < (long)V->n) {
    memset(V->v,0,(long)V->n << 3);
  }
  local_118.n = 0;
  local_118.v = (double *)0x0;
  DVector<double>::init(&local_118,ctx);
  local_50.n = 0;
  local_50.v = (double *)0x0;
  local_f0 = V;
  local_e8 = pEVar30;
  local_78 = (ulong)uVar16;
  DVector<double>::init(&local_50,(EVP_PKEY_CTX *)(ulong)(uint)local_c8.nrows);
  local_b0 = (EVP_PKEY_CTX *)(lVar14 - 1);
  pEVar30 = local_b0;
  if (iVar20 < (int)local_b0) {
    pEVar30 = pEVar5;
  }
  local_98 = (double *)((ulong)pEVar30 & 0xffffffff);
  uVar16 = iVar20 - 2U;
  if (local_c8.nrows < (int)(iVar20 - 2U)) {
    uVar16 = local_c8.nrows;
  }
  local_80 = (double *)0x0;
  if (0 < (int)uVar16) {
    local_80 = (double *)(ulong)uVar16;
  }
  pdVar6 = local_80;
  if ((int)local_80 < (int)pEVar30) {
    pdVar6 = local_98;
  }
  lVar11 = (long)(int)pEVar30;
  local_68 = (long)(int)uVar16;
  if ((int)pdVar6 != 0) {
    local_70 = (double *)CONCAT44(local_70._4_4_,local_c8.nrows - 2);
    local_148 = (EVP_PKEY_CTX *)0x1;
    local_d8 = 8;
    local_138 = 0;
    pdVar8 = (double *)0x0;
    pdVar28 = local_e0;
    pEVar30 = pEVar5;
    auVar37 = _DAT_001210b0;
    local_a8 = pdVar6;
    do {
      pdVar6 = local_e0;
      iVar22 = (int)pdVar8;
      if ((long)pdVar8 < lVar11) {
        W->v[(long)pdVar8] = 0.0;
        if ((long)pdVar8 < lVar14) {
          uVar36 = (ulong)pdVar8 & 0xffffffff;
          do {
            dVar32 = W->v[(long)pdVar8];
            if ((dVar32 != 0.0) || (NAN(dVar32))) {
              dVar31 = local_c8.v[(long)((long)pdVar8 + (long)(int)uVar36 * (long)local_c8.ncols)] /
                       dVar32;
              dVar31 = dVar31 * dVar31 + 1.0;
              if (dVar31 < 0.0) {
                uStack_100 = 0;
                local_108 = dVar32;
                dVar31 = sqrt(dVar31);
                auVar37 = _DAT_001210b0;
                dVar32 = local_108;
              }
              else {
                dVar31 = SQRT(dVar31);
              }
              dVar31 = ABS(dVar32) * dVar31;
            }
            else {
              dVar31 = ABS(local_c8.v
                           [(long)((long)pdVar8 + (long)(int)uVar36 * (long)local_c8.ncols)]);
            }
            W->v[(long)pdVar8] = dVar31;
            uVar16 = (int)uVar36 + 1;
            uVar36 = (ulong)uVar16;
          } while ((uint)pdVar6 != uVar16);
        }
        pdVar6 = W->v;
        dVar32 = pdVar6[(long)pdVar8];
        if ((dVar32 != 0.0) || (NAN(dVar32))) {
          iVar19 = iVar22 * (local_c8.ncols + 1U);
          if (local_c8.v[iVar19] <= 0.0 && local_c8.v[iVar19] != 0.0) {
            pdVar6[(long)pdVar8] = (double)((ulong)dVar32 ^ auVar37._0_8_);
          }
          if ((long)pdVar8 < lVar14) {
            pdVar21 = (double *)(((long)local_c8.ncols + 1) * local_138 + (long)local_c8.v);
            pdVar23 = pdVar28;
            do {
              *pdVar21 = *pdVar21 / pdVar6[(long)pdVar8];
              pdVar21 = pdVar21 + local_c8.ncols;
              pdVar23 = (double *)((long)pdVar23 + -1);
            } while (pdVar23 != (double *)0x0);
          }
          local_c8.v[iVar19] = local_c8.v[iVar19] + 1.0;
        }
        pdVar6[(long)pdVar8] = (double)((ulong)pdVar6[(long)pdVar8] ^ auVar37._0_8_);
      }
      pdVar6 = (double *)((long)pdVar8 + 1);
      if ((long)pdVar6 < (long)ctx) {
        pdVar23 = W->v;
        lVar12 = (long)local_c8.ncols;
        lVar24 = local_138 * lVar12 + local_d8;
        lVar13 = (lVar12 + 1) * local_138;
        pEVar26 = local_148;
        do {
          if (((long)pdVar8 < lVar11) &&
             ((pdVar23[(long)pdVar8] != 0.0 || (NAN(pdVar23[(long)pdVar8]))))) {
            dVar32 = 0.0;
            pdVar21 = local_c8.v;
            pdVar17 = pdVar28;
            if ((long)pdVar8 < lVar14) {
              do {
                dVar32 = dVar32 + *(double *)((long)pdVar21 + lVar13) *
                                  *(double *)((long)pdVar21 + lVar24);
                pdVar17 = (double *)((long)pdVar17 + -1);
                pdVar21 = pdVar21 + lVar12;
              } while (pdVar17 != (double *)0x0);
            }
            if ((long)pdVar8 < lVar14) {
              dVar31 = local_c8.v[(int)(iVar22 * (local_c8.ncols + 1U))];
              pdVar21 = pdVar28;
              pdVar17 = local_c8.v;
              do {
                *(double *)((long)pdVar17 + lVar24) =
                     *(double *)((long)pdVar17 + lVar13) *
                     ((double)((ulong)dVar32 ^ auVar37._0_8_) / dVar31) +
                     *(double *)((long)pdVar17 + lVar24);
                pdVar17 = pdVar17 + lVar12;
                pdVar21 = (double *)((long)pdVar21 + -1);
              } while (pdVar21 != (double *)0x0);
            }
          }
          local_118.v[(long)pEVar26] = local_c8.v[(long)(pEVar26 + (long)pdVar8 * lVar12)];
          pEVar26 = pEVar26 + 1;
          lVar24 = lVar24 + 8;
        } while (pEVar26 != pEVar5);
      }
      if ((long)pdVar8 < lVar14 && (long)pdVar8 < lVar11) {
        pdVar21 = (double *)(((long)local_c8.ncols + 1) * local_138 + (long)local_c8.v);
        iVar19 = U->ncols;
        pdVar17 = (double *)(((long)iVar19 + 1) * local_138 + (long)U->v);
        pdVar23 = pdVar28;
        do {
          *pdVar17 = *pdVar21;
          pdVar21 = pdVar21 + local_c8.ncols;
          pdVar17 = pdVar17 + iVar19;
          pdVar23 = (double *)((long)pdVar23 + -1);
        } while (pdVar23 != (double *)0x0);
      }
      if ((long)pdVar8 < local_68) {
        local_118.v[(long)pdVar8] = 0.0;
        pEVar26 = local_148;
        if ((long)pdVar6 < (long)ctx) {
          do {
            dVar32 = local_118.v[(long)pdVar8];
            if ((dVar32 != 0.0) || (NAN(dVar32))) {
              dVar31 = local_118.v[(long)pEVar26] / dVar32;
              dVar31 = dVar31 * dVar31 + 1.0;
              if (dVar31 < 0.0) {
                uStack_100 = 0;
                local_108 = dVar32;
                dVar31 = sqrt(dVar31);
                auVar37 = _DAT_001210b0;
                dVar32 = local_108;
              }
              else {
                dVar31 = SQRT(dVar31);
              }
              dVar31 = ABS(dVar32) * dVar31;
            }
            else {
              dVar31 = ABS(local_118.v[(long)pEVar26]);
            }
            local_118.v[(long)pdVar8] = dVar31;
            pEVar26 = pEVar26 + 1;
          } while (pEVar5 != pEVar26);
        }
        pdVar23 = local_118.v;
        dVar32 = local_118.v[(long)pdVar8];
        if ((dVar32 != 0.0) || (NAN(dVar32))) {
          if (local_118.v[(long)pdVar6] <= 0.0 && local_118.v[(long)pdVar6] != 0.0) {
            local_118.v[(long)pdVar8] = (double)((ulong)dVar32 ^ auVar37._0_8_);
          }
          if ((long)pdVar6 < (long)ctx) {
            pEVar26 = (EVP_PKEY_CTX *)0x1;
            do {
              *(double *)((long)local_118.v + (long)pEVar26 * 8 + local_138) =
                   *(double *)((long)local_118.v + (long)pEVar26 * 8 + local_138) /
                   local_118.v[(long)pdVar8];
              pEVar26 = pEVar26 + 1;
            } while (pEVar30 != pEVar26);
          }
          local_118.v[(long)pdVar6] = local_118.v[(long)pdVar6] + 1.0;
        }
        dVar32 = local_118.v[(long)pdVar8];
        local_118.v[(long)pdVar8] = (double)((ulong)dVar32 ^ auVar37._0_8_);
        if (((long)pdVar6 < lVar14) && ((dVar32 != 0.0 || (NAN(dVar32))))) {
          memset(local_50.v + (long)pdVar8 + 1,0,(ulong)(uint)((int)local_70 - iVar22) * 8 + 8);
          if ((long)pdVar6 < (long)ctx) {
            pdVar8 = (double *)(((long)local_c8.ncols + 1) * local_d8 + (long)local_c8.v);
            pEVar26 = local_148;
            do {
              pdVar17 = (double *)0x1;
              pdVar21 = pdVar8;
              do {
                *(double *)((long)local_50.v + (long)pdVar17 * 8 + local_138) =
                     pdVar23[(long)pEVar26] * *pdVar21 +
                     *(double *)((long)local_50.v + (long)pdVar17 * 8 + local_138);
                pdVar21 = pdVar21 + local_c8.ncols;
                pdVar17 = (double *)((long)pdVar17 + 1);
              } while (pdVar28 != pdVar17);
              pEVar26 = pEVar26 + 1;
              pdVar8 = pdVar8 + 1;
            } while (pEVar26 != pEVar5);
          }
          auVar37 = _DAT_001210b0;
          uVar36 = (ulong)DAT_001210b0;
          if ((long)pdVar6 < (long)ctx) {
            pdVar8 = (double *)(((long)local_c8.ncols + 1) * local_d8 + (long)local_c8.v);
            pEVar26 = local_148;
            do {
              if ((long)pdVar6 < lVar14) {
                dVar32 = pdVar23[(long)pEVar26];
                dVar31 = pdVar23[(long)pdVar6];
                pdVar17 = (double *)0x1;
                pdVar21 = pdVar8;
                do {
                  *pdVar21 = *(double *)((long)local_50.v + (long)pdVar17 * 8 + local_138) *
                             ((double)((ulong)dVar32 ^ uVar36) / dVar31) + *pdVar21;
                  pdVar21 = pdVar21 + local_c8.ncols;
                  pdVar17 = (double *)((long)pdVar17 + 1);
                } while (pdVar28 != pdVar17);
              }
              pEVar26 = pEVar26 + 1;
              pdVar8 = pdVar8 + 1;
            } while (pEVar26 != pEVar5);
          }
        }
        if ((long)pdVar6 < (long)ctx) {
          iVar22 = local_f0->ncols;
          puVar9 = (undefined8 *)(local_d8 * (long)iVar22 + local_138 + (long)local_f0->v);
          pEVar26 = (EVP_PKEY_CTX *)0x1;
          do {
            *puVar9 = *(undefined8 *)((long)pdVar23 + (long)pEVar26 * 8 + local_138);
            puVar9 = puVar9 + iVar22;
            pEVar26 = pEVar26 + 1;
          } while (pEVar30 != pEVar26);
        }
      }
      local_148 = local_148 + 1;
      local_138 = local_138 + 8;
      pdVar28 = (double *)((long)pdVar28 + -1);
      local_d8 = local_d8 + 8;
      pEVar30 = pEVar30 + -1;
      pdVar8 = pdVar6;
    } while (pdVar6 != local_a8);
  }
  iVar22 = (int)local_98;
  if (local_c8.nrows <= iVar20) {
    W->v[lVar11] = local_c8.v[(int)((local_c8.ncols + 1U) * iVar22)];
  }
  iVar19 = (int)local_e8;
  if (local_c8.nrows < iVar20) {
    W->v[(long)iVar19 + -1] = 0.0;
  }
  if ((int)local_80 + 1 < iVar19) {
    local_118.v[(ulong)local_80 & 0xffffffff] =
         local_c8.v[iVar19 + (int)local_80 * local_c8.ncols + -1];
  }
  local_80 = local_118.v;
  local_118.v[(long)iVar19 + -1] = 0.0;
  auVar3 = _DAT_00121080;
  auVar37 = _DAT_00121070;
  iVar27 = (int)local_78;
  iVar25 = (int)local_e0;
  if (iVar22 < iVar27) {
    pdVar6 = U->v;
    iVar4 = U->ncols;
    uVar16 = (uint)local_b0;
    if (iVar20 < (int)(uint)local_b0) {
      uVar16 = iVar20;
    }
    lVar11 = (long)(int)uVar16;
    lVar12 = (ulong)(uint)local_c8.nrows - 1;
    auVar33._8_4_ = (int)lVar12;
    auVar33._0_8_ = lVar12;
    auVar33._12_4_ = (int)((ulong)lVar12 >> 0x20);
    pdVar8 = pdVar6 + lVar11;
    auVar33 = auVar33 ^ _DAT_00121080;
    do {
      pdVar28 = pdVar8;
      uVar36 = (ulong)(local_c8.nrows + 1U & 0xfffffffe);
      auVar43 = auVar37;
      if (0 < iVar25) {
        do {
          bVar2 = auVar33._0_4_ < SUB164(auVar43 ^ auVar3,0);
          iVar35 = auVar33._4_4_;
          iVar7 = SUB164(auVar43 ^ auVar3,4);
          if ((bool)(~(iVar35 < iVar7 || iVar7 == iVar35 && bVar2) & 1)) {
            *pdVar28 = 0.0;
          }
          if (iVar35 >= iVar7 && (iVar7 != iVar35 || !bVar2)) {
            pdVar28[iVar4] = 0.0;
          }
          auVar38._0_8_ = auVar43._0_8_ + 2;
          auVar38._8_8_ = auVar43._8_8_ + 2;
          uVar36 = uVar36 - 2;
          pdVar28 = pdVar28 + (long)iVar4 * 2;
          auVar43 = auVar38;
        } while (uVar36 != 0);
      }
      pdVar6[(iVar4 + 1) * (int)lVar11] = 1.0;
      lVar11 = lVar11 + 1;
      pdVar8 = pdVar8 + 1;
    } while ((iVar27 + uVar16) - iVar22 != (int)lVar11);
  }
  auVar3 = _DAT_00121080;
  auVar37 = _DAT_00121070;
  if (0 < iVar22) {
    local_70 = W->v;
    pdVar6 = U->v;
    local_38 = (long)U->ncols;
    iVar4 = U->ncols + 1;
    uVar16 = (uint)local_b0;
    if (iVar20 < (int)(uint)local_b0) {
      uVar16 = iVar20;
    }
    dVar32 = (double)(long)(int)uVar16;
    uVar29 = iVar22 - 2;
    local_40 = (ulong)(local_c8.nrows + 1U & 0xfffffffe);
    lVar11 = (ulong)(uint)local_c8.nrows - 1;
    auVar43._8_4_ = (int)lVar11;
    auVar43._0_8_ = lVar11;
    auVar43._12_4_ = (int)((ulong)lVar11 >> 0x20);
    lVar11 = (long)dVar32 * 8;
    lVar12 = ((long)dVar32 + -1) * local_38;
    local_148 = (EVP_PKEY_CTX *)(pdVar6 + lVar12 + (long)dVar32);
    local_78 = local_38 * 8 ^ 0xfffffffffffffff8;
    pdVar8 = pdVar6 + lVar12 + (long)dVar32 + -1;
    iVar22 = local_c8.nrows - uVar16;
    local_d8 = (long)dVar32 * 8 - 8;
    local_e0 = pdVar6 + (long)dVar32 + -1;
    local_a8 = local_e0;
    do {
      iVar22 = iVar22 + 1;
      pdVar28 = (double *)(ulong)uVar29;
      dVar31 = (double)((long)dVar32 + -1);
      iVar35 = SUB84(dVar31,0);
      if ((local_70[(long)dVar32 + -1] != 0.0) || (NAN(local_70[(long)dVar32 + -1]))) {
        if ((long)dVar32 < (long)iVar27) {
          pdVar23 = U->v;
          lVar13 = (long)U->ncols;
          lVar12 = (long)pdVar23 + local_d8 * lVar13 + lVar11;
          dVar15 = dVar32;
          pEVar5 = local_148;
          do {
            dVar40 = 0.0;
            if ((long)dVar32 <= lVar14) {
              lVar24 = 0;
              iVar7 = iVar22;
              do {
                dVar40 = dVar40 + *(double *)((long)pdVar23 + lVar24 + (lVar13 + 1) * local_d8) *
                                  *(double *)(lVar12 + lVar24);
                lVar24 = lVar24 + lVar13 * 8;
                iVar7 = iVar7 + -1;
              } while (iVar7 != 0);
            }
            if ((long)dVar32 <= (long)iVar25) {
              dVar1 = pdVar6[iVar4 * iVar35];
              lVar24 = 0;
              iVar7 = iVar22;
              do {
                *(double *)((long)pEVar5 + lVar24) =
                     *(double *)((long)pdVar8 + lVar24) * (-dVar40 / dVar1) +
                     *(double *)((long)pEVar5 + lVar24);
                lVar24 = lVar24 + local_38 * 8;
                iVar7 = iVar7 + -1;
              } while (iVar7 != 0);
            }
            dVar15 = (double)((long)dVar15 + 1);
            lVar12 = lVar12 + 8;
            pEVar5 = (EVP_PKEY_CTX *)((long)pEVar5 + 8);
          } while ((long)dVar15 < (long)iVar27);
        }
        pdVar23 = pdVar8;
        iVar7 = iVar22;
        if ((long)dVar32 <= lVar14) {
          do {
            *pdVar23 = -*pdVar23;
            pdVar23 = pdVar23 + local_38;
            iVar7 = iVar7 + -1;
          } while (iVar7 != 0);
        }
        pdVar6[iVar4 * iVar35] = pdVar6[iVar4 * iVar35] + 1.0;
        local_108 = dVar31;
        local_98 = pdVar28;
        if (2 < (long)dVar32) {
          uVar36 = (long)pdVar28 + 1U & 0xfffffffffffffffe;
          lVar12 = (long)pdVar28 + -1;
          auVar41._8_4_ = (int)lVar12;
          auVar41._0_8_ = lVar12;
          auVar41._12_4_ = (int)((ulong)lVar12 >> 0x20);
          pdVar28 = local_a8;
          auVar44 = auVar37;
          do {
            bVar2 = SUB164(auVar41 ^ auVar3,0) < SUB164(auVar44 ^ auVar3,0);
            iVar35 = SUB164(auVar41 ^ auVar3,4);
            iVar7 = SUB164(auVar44 ^ auVar3,4);
            if ((bool)(~(iVar35 < iVar7 || iVar7 == iVar35 && bVar2) & 1)) {
              *pdVar28 = 0.0;
            }
            if (iVar35 >= iVar7 && (iVar7 != iVar35 || !bVar2)) {
              pdVar28[local_38] = 0.0;
            }
            lVar12 = auVar44._8_8_;
            auVar44._0_8_ = auVar44._0_8_ + 2;
            auVar44._8_8_ = lVar12 + 2;
            pdVar28 = pdVar28 + local_38 * 2;
            uVar36 = uVar36 - 2;
          } while (uVar36 != 0);
        }
      }
      else {
        uVar36 = local_40;
        pdVar28 = local_e0;
        auVar33 = auVar37;
        if (0 < local_c8.nrows) {
          do {
            bVar2 = SUB164(auVar43 ^ auVar3,0) < SUB164(auVar33 ^ auVar3,0);
            iVar7 = SUB164(auVar43 ^ auVar3,4);
            iVar45 = SUB164(auVar33 ^ auVar3,4);
            if ((iVar7 < iVar45 || iVar45 == iVar7 && bVar2) != true) {
              *pdVar28 = 0.0;
            }
            if (iVar7 >= iVar45 && (iVar45 != iVar7 || !bVar2)) {
              pdVar28[local_38] = 0.0;
            }
            auVar42._0_8_ = auVar33._0_8_ + 2;
            auVar42._8_8_ = auVar33._8_8_ + 2;
            uVar36 = uVar36 - 2;
            pdVar28 = pdVar28 + local_38 * 2;
            auVar33 = auVar42;
          } while (uVar36 != 0);
        }
        pdVar6[iVar4 * iVar35] = 1.0;
      }
      uVar29 = uVar29 - 1;
      local_e0 = local_e0 + -1;
      lVar11 = lVar11 + -8;
      local_d8 = local_d8 - 8;
      local_148 = (EVP_PKEY_CTX *)((long)local_148 + local_78);
      pdVar8 = (double *)((long)pdVar8 + local_78);
      local_a8 = local_a8 + -1;
      bVar2 = 1 < (long)dVar32;
      dVar32 = dVar31;
    } while (bVar2);
  }
  auVar3 = _DAT_00121080;
  auVar37 = _DAT_00121070;
  if (0 < iVar20) {
    pdVar8 = local_f0->v;
    iVar22 = local_f0->ncols;
    local_a8 = (double *)(long)iVar22;
    local_d8 = (ulong)(iVar20 + 1U & 0xfffffffe);
    pEVar5 = ctx + -1;
    auVar34._8_4_ = (int)pEVar5;
    auVar34._0_8_ = pEVar5;
    auVar34._12_4_ = (int)((ulong)pEVar5 >> 0x20);
    local_108 = (double)((long)ctx * 8);
    local_138 = (long)ctx * 8;
    lVar14 = ((long)local_a8 * 8 + 8) * (long)ctx;
    local_128 = (double *)((long)pdVar8 + lVar14);
    local_98 = (double *)((long)local_a8 * 8 ^ 0xfffffffffffffff8);
    lVar14 = (long)pdVar8 + lVar14 + -8;
    pdVar6 = pdVar8 + (long)ctx;
    iVar27 = 0;
    auVar34 = auVar34 ^ _DAT_00121080;
    pEVar5 = ctx;
    do {
      local_138 = local_138 + -8;
      pdVar6 = pdVar6 + -1;
      pEVar30 = pEVar5 + -1;
      uVar36 = local_d8;
      pdVar28 = pdVar6;
      auVar33 = auVar37;
      if (((long)pEVar5 <= local_68) &&
         (((local_118.v[(long)(pEVar5 + -1)] != 0.0 || (NAN(local_118.v[(long)(pEVar5 + -1)]))) &&
          ((long)pEVar5 < (long)ctx)))) {
        pdVar23 = local_f0->v;
        lVar12 = (long)local_f0->ncols;
        lVar11 = (lVar12 + 1) * (long)local_108;
        pdVar21 = local_128;
        pEVar26 = pEVar5;
        do {
          dVar32 = 0.0;
          pdVar17 = pdVar23;
          iVar25 = iVar27;
          do {
            dVar32 = dVar32 + *(double *)((long)pdVar17 + (long)local_108 * lVar12 + local_138) *
                              *(double *)((long)pdVar17 + lVar11);
            pdVar17 = pdVar17 + lVar12;
            iVar25 = iVar25 + -1;
          } while (iVar25 != 0);
          dVar31 = pdVar8[(long)(pEVar30 + (long)pEVar5 * (long)local_a8)];
          lVar13 = 0;
          iVar25 = iVar27;
          do {
            *(double *)((long)pdVar21 + lVar13) =
                 *(double *)(lVar14 + lVar13) * (-dVar32 / dVar31) +
                 *(double *)((long)pdVar21 + lVar13);
            lVar13 = lVar13 + (long)local_a8 * 8;
            iVar25 = iVar25 + -1;
          } while (iVar25 != 0);
          pEVar26 = pEVar26 + 1;
          lVar11 = lVar11 + 8;
          pdVar21 = pdVar21 + 1;
        } while (iVar20 != (uint)pEVar26);
      }
      do {
        auVar43 = auVar33 ^ auVar3;
        if ((bool)(~(auVar43._4_4_ == auVar34._4_4_ && auVar34._0_4_ < auVar43._0_4_ ||
                    auVar34._4_4_ < auVar43._4_4_) & 1)) {
          *pdVar28 = 0.0;
        }
        if ((auVar43._12_4_ != auVar34._12_4_ || auVar43._8_4_ <= auVar34._8_4_) &&
            auVar43._12_4_ <= auVar34._12_4_) {
          pdVar28[(long)local_a8] = 0.0;
        }
        auVar39._0_8_ = auVar33._0_8_ + 2;
        auVar39._8_8_ = auVar33._8_8_ + 2;
        uVar36 = uVar36 - 2;
        pdVar28 = pdVar28 + (long)local_a8 * 2;
        auVar33 = auVar39;
      } while (uVar36 != 0);
      pdVar8[(iVar22 + 1) * (int)pEVar30] = 1.0;
      local_108 = (double)((long)local_108 + -8);
      iVar27 = iVar27 + 1;
      local_128 = (double *)((long)local_128 + (long)local_98);
      lVar14 = lVar14 + (long)local_98;
      bVar2 = 1 < (long)pEVar5;
      pEVar5 = pEVar30;
    } while (bVar2);
  }
  if (iVar19 < 1) {
    if (local_50.v != (double *)0x0) {
      operator_delete__(local_50.v);
    }
    if (local_118.v != (double *)0x0) {
      operator_delete__(local_118.v);
    }
    if (local_c8.v != (double *)0x0) {
      operator_delete__(local_c8.v);
    }
    return;
  }
  uVar16 = iVar19 - 2;
  uVar36 = (ulong)uVar16;
  if (uVar16 != 0xffffffff) {
    uVar18 = (ulong)local_e8 & 0xffffffff;
    do {
      if (ABS(local_118.v[uVar18 - 2]) <=
          (ABS((W->v + (uVar18 - 2))[1]) + ABS(W->v[uVar18 - 2])) * 2.220446049250313e-16 +
          1.6033346880071782e-291) {
        uVar36 = (ulong)((int)uVar18 - 2);
        local_118.v[uVar18 - 2] = 0.0;
        goto LAB_0010e3bd;
      }
      uVar18 = uVar18 - 1;
    } while (uVar18 != 1);
    uVar36 = 0xffffffff;
  }
LAB_0010e3bd:
  uVar29 = (uint)uVar36;
  iVar20 = 4;
  if (uVar29 != uVar16) {
    uVar16 = iVar19 - 1;
    uVar18 = (ulong)uVar16;
    if ((int)uVar29 < (int)uVar16) {
      uVar18 = ((ulong)local_e8 & 0xffffffff) - 1;
      do {
        dVar32 = 0.0;
        if ((long)(int)(uVar29 + 1) != uVar18) {
          dVar32 = ABS(local_118.v[uVar18 - 1]);
        }
        if (ABS(W->v[uVar18]) <=
            (ABS(local_118.v[uVar18]) + dVar32) * 2.220446049250313e-16 + 1.6033346880071782e-291) {
          W->v[uVar18] = 0.0;
          break;
        }
        uVar18 = uVar18 - 1;
      } while ((long)(int)uVar29 < (long)uVar18);
    }
    uVar10 = (uint)uVar18;
    uVar18 = uVar18 & 0xffffffff;
    if (uVar10 == uVar16) {
      uVar18 = uVar36;
    }
    uVar36 = uVar18;
    iVar20 = (uVar10 != uVar16) + 1;
    if (uVar10 == uVar29) {
      iVar20 = 3;
    }
  }
  (*(code *)(&DAT_001210e0 + *(int *)(&DAT_001210e0 + (ulong)(iVar20 - 1) * 4)))
            ((ulong)(iVar20 - 1),&DAT_001210e0,
             &DAT_001210e0 + *(int *)(&DAT_001210e0 + (ulong)(iVar20 - 1) * 4),uVar36);
  return;
}

Assistant:

void svd(const Matrixd &a, Matrixd &U, Vectord &W, Matrixd &V, bool thin)
{
  const bool wantu=true;
  const bool wantv=true;

  Matrixd A(a);

  const int m=A.rows();
  const int n=A.cols();
  const int ncu=thin?std::min(m, n):m;

  U.init(m, ncu); U=0;
  W.init(std::min(m+1, n));
  V.init(n, n); V=0;

  Vectord e(n);
  Vectord work(m);

  // Reduce A to bidiagonal form, storing the diagonal elements
  // in W and the super-diagonal elements in e.

  int nct=std::min(m-1, n);
  int nrt=std::max(0, std::min(n-2, m));
  int lu=std::max(nct, nrt);

  for (int k=0; k<lu; k++)
  {
    if (k < nct)
    {
      // Compute the transformation for the k-th column and
      // place the k-th diagonal in W[k].
      // Compute 2-norm of k-th column without under/overflow.

      W[k]=0;

      for (int i=k; i<m; i++)
      {
        W[k]=hypot(W[k], A(i, k));
      }

      if (W[k] != 0.0)
      {
        if (A(k, k) < 0.0)
        {
          W[k]=-W[k];
        }

        for (int i=k; i<m; i++)
        {
          A(i, k)/=W[k];
        }

        A(k, k)+=1.0;
      }

      W[k]=-W[k];
    }

    for (int j=k+1; j<n; j++)
    {
      if ((k < nct) & (W[k] != 0.0))
      {
        // Apply the transformation.

        double t=0;

        for (int i=k; i<m; i++)
        {
          t+=A(i, k)*A(i, j);
        }

        t=-t/A(k, k);

        for (int i=k; i<m; i++)
        {
          A(i, j)+=t*A(i, k);
        }
      }

      // Place the k-th row of A into e for the
      // subsequent calculation of the row transformation.

      e[j]=A(k, j);
    }

    if (wantu & (k < nct))
    {
      // Place the transformation in U for subsequent back
      // multiplication.

      for (int i=k; i<m; i++)
      {
        U(i, k)=A(i, k);
      }
    }

    if (k < nrt)
    {
      // Compute the k-th row transformation and place the
      // k-th super-diagonal in e[k].
      // Compute 2-norm without under/overflow.

      e[k]=0;

      for (int i=k+1; i<n; i++)
      {
        e[k]=hypot(e[k], e[i]);
      }

      if (e[k] != 0.0)
      {
        if (e[k+1] < 0.0)
        {
          e[k]=-e[k];
        }

        for (int i=k+1; i<n; i++)
        {
          e[i]/=e[k];
        }

        e[k+1]+=1.0;
      }

      e[k]=-e[k];

      if ((k+1 < m) & (e[k] != 0.0))
      {
        // Apply the transformation.

        for (int i=k+1; i<m; i++)
        {
          work[i]=0.0;
        }

        for (int j=k+1; j<n; j++)
        {
          for (int i=k+1; i<m; i++)
          {
            work[i]+=e[j]*A(i, j);
          }
        }

        for (int j=k+1; j<n; j++)
        {
          double t=-e[j]/e[k+1];

          for (int i=k+1; i<m; i++)
          {
            A(i, j)+=t*work[i];
          }
        }
      }

      if (wantv)
      {
        // Place the transformation in V for subsequent
        // back multiplication.

        for (int i=k+1; i<n; i++)
        {
          V(i, k)=e[i];
        }
      }
    }
  }

  // Set up the final bidiagonal matrix or order p.

  int p=std::min(n, m+1);

  if (nct < n)
  {
    W[nct]=A(nct, nct);
  }

  if (m < p)
  {
    W[p-1]=0.0;
  }

  if (nrt+1 < p)
  {
    e[nrt]=A(nrt, p-1);
  }

  e[p-1]=0.0;

  // If required, generate U.

  if (wantu)
  {
    for (int j=nct; j<ncu; j++)
    {
      for (int i=0; i<m; i++)
      {
        U(i, j)=0.0;
      }

      U(j, j)=1.0;
    }

    for (int k=nct-1; k>=0; k--)
    {
      if (W[k] != 0.0)
      {
        for (int j=k+1; j<ncu; j++)
        {
          double t=0;

          for (int i=k; i<m; i++)
          {
            t+=U(i, k)*U(i, j);
          }

          t=-t/U(k, k);

          for (int i=k; i<m; i++)
          {
            U(i, j)+=t*U(i, k);
          }
        }

        for (int i=k; i<m; i++)
        {
          U(i, k)=-U(i, k);
        }

        U(k, k)+=1.0;

        for (int i=0; i<k-1; i++)
        {
          U(i, k)=0.0;
        }
      }
      else
      {
        for (int i=0; i<m; i++)
        {
          U(i, k)=0.0;
        }

        U(k, k)=1.0;
      }
    }
  }

  // If required, generate V.

  if (wantv)
  {
    for (int k=n-1; k>=0; k--)
    {
      if ((k < nrt) & (e[k] != 0.0))
      {
        for (int j=k+1; j<n; j++)
        {
          double t=0;

          for (int i=k+1; i<n; i++)
          {
            t+=V(i, k)*V(i, j);
          }

          t=-t/V(k+1, k);

          for (int i=k+1; i<n; i++)
          {
            V(i, j)+=t*V(i, k);
          }
        }
      }

      for (int i=0; i<n; i++)
      {
        V(i, k)=0.0;
      }

      V(k, k)=1.0;
    }
  }

  // Main iteration loop for the singular values.

  int pp=p-1;
  int iter=0;
  double eps=pow(2.0,-52.0);
  double tiny=pow(2.0,-966.0);

  while (p > 0)
  {
    int k, kase;

    // Here is where a test for too many iterations would go.

    // This section of the program inspects for
    // negligible elements in the s and e arrays. On
    // completion the variables kase and k are set as follows.

    // kase = 1     if s(p) and e[k-1] are negligible and k<p
    // kase = 2     if s(k) is negligible and k<p
    // kase = 3     if e[k-1] is negligible, k<p, and
    //              s(k), ..., s(p) are not negligible (qr step).
    // kase = 4     if e(p-1) is negligible (convergence).

    for (k=p-2; k>=-1; k--)
    {
      if (k == -1)
      {
        break;
      }

      if (std::abs(e[k]) <= tiny+eps*(std::abs(W[k])+std::abs(W[k+1])))
      {
        e[k]=0.0;
        break;
      }
    }

    if (k == p-2)
    {
      kase=4;
    }
    else
    {
      int ks;

      for (ks=p-1; ks>=k; ks--)
      {
        if (ks == k)
        {
          break;
        }

        double t=(ks != p ? std::abs(e[ks]) : 0.) +
                 (ks != k+1 ? std::abs(e[ks-1]) : 0.);

        if (std::abs(W[ks]) <= tiny+eps*t)
        {
          W[ks]=0.0;
          break;
        }
      }

      if (ks == k)
      {
        kase=3;
      }
      else if (ks == p-1)
      {
        kase=1;
      }
      else
      {
        kase=2;
        k=ks;
      }
    }

    k++;

    // Perform the task indicated by kase.

    switch (kase)
    {

        // Deflate negligible s(p).

      case 1:
        {
          double f=e[p-2];
          e[p-2]=0.0;

          for (int j=p-2; j>=k; j--)
          {
            double t=hypot(W[j],f);
            double cs=W[j]/t;
            double sn=f/t;
            W[j]=t;

            if (j != k)
            {
              f=-sn*e[j-1];
              e[j-1]=cs*e[j-1];
            }

            if (wantv)
            {
              for (int i=0; i<n; i++)
              {
                t=cs*V(i, j)+sn*V(i, p-1);
                V(i, p-1)=-sn*V(i, j)+cs*V(i, p-1);
                V(i, j)=t;
              }
            }
          }
        }
        break;

        // Split at negligible s(k).

      case 2:
        {
          double f=e[k-1];
          e[k-1]=0.0;

          for (int j=k; j<p; j++)
          {
            double t=hypot(W[j],f);
            double cs=W[j]/t;
            double sn=f/t;
            W[j]=t;
            f=-sn*e[j];
            e[j]=cs*e[j];

            if (wantu)
            {
              for (int i=0; i<m; i++)
              {
                t=cs*U(i, j)+sn*U(i, k-1);
                U(i, k-1)=-sn*U(i, j)+cs*U(i, k-1);
                U(i, j)=t;
              }
            }
          }
        }
        break;

        // Perform one qr step.

      case 3:
        {

          // Calculate the shift.

          double scale=std::max(std::max(std::max(std::max(std::abs(W[p-1]), std::abs(W[p-2])),
                                                  std::abs(e[p-2])), std::abs(W[k])), std::abs(e[k]));
          double sp=W[p-1]/scale;
          double spm1=W[p-2]/scale;
          double epm1=e[p-2]/scale;
          double sk=W[k]/scale;
          double ek=e[k]/scale;
          double b=((spm1+sp)*(spm1-sp)+epm1*epm1)/2.0;
          double c=(sp*epm1)*(sp*epm1);
          double shift=0.0;

          if ((b != 0.0) | (c != 0.0))
          {
            shift=sqrt(b*b + c);

            if (b < 0.0)
            {
              shift=-shift;
            }

            shift=c/(b + shift);
          }

          double f=(sk + sp)*(sk - sp) + shift;
          double g=sk*ek;

          // Chase zeros.

          for (int j=k; j<p-1; j++)
          {
            double t=hypot(f, g);
            double cs=f/t;
            double sn=g/t;

            if (j != k)
            {
              e[j-1]=t;
            }

            f=cs*W[j]+sn*e[j];
            e[j]=cs*e[j]-sn*W[j];
            g=sn*W[j+1];
            W[j+1]=cs*W[j+1];

            if (wantv)
            {
              for (int i=0; i<n; i++)
              {
                t=cs*V(i, j)+sn*V(i, j+1);
                V(i, j+1)=-sn*V(i, j)+cs*V(i, j+1);
                V(i, j)=t;
              }
            }

            t=hypot(f,g);
            cs=f/t;
            sn=g/t;
            W[j]=t;
            f=cs*e[j]+sn*W[j+1];
            W[j+1]=-sn*e[j]+cs*W[j+1];
            g=sn*e[j+1];
            e[j+1]=cs*e[j+1];

            if (wantu && (j < m-1))
            {
              for (int i=0; i<m; i++)
              {
                t=cs*U(i, j)+sn*U(i, j+1);
                U(i, j+1)=-sn*U(i, j)+cs*U(i, j+1);
                U(i, j)=t;
              }
            }
          }

          e[p-2]=f;
          iter++;
        }
        break;

        // Convergence.

      case 4:
        {

          // Make the singular values positive.

          if (W[k] <= 0.0)
          {
            W[k]=(W[k] < 0.0 ? -W[k] : 0.0);

            if (wantv)
            {
              for (int i=0; i<n; i++)
              {
                V(i, k)=-V(i, k);
              }
            }
          }

          // Order the singular values.

          while (k < pp)
          {
            if (W[k] >= W[k+1])
            {
              break;
            }

            double t=W[k];
            W[k]=W[k+1];
            W[k+1]=t;

            if (wantv && (k < n-1))
            {
              for (int i=0; i<n; i++)
              {
                t=V(i, k+1);
                V(i, k+1)=V(i, k);
                V(i, k)=t;
              }
            }

            if (wantu && (k < m-1))
            {
              for (int i=0; i<m; i++)
              {
                t=U(i, k+1);
                U(i, k+1)=U(i, k);
                U(i, k)=t;
              }
            }

            k++;
          }

          iter=0;
          p--;
        }
        break;
    }
  }
}